

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_StartScript(FParser *this)

{
  uint uVar1;
  DFraggleThinker *this_00;
  DFsScript *pDVar2;
  DRunningScript *this_01;
  AActor *trigger;
  size_t in_RSI;
  DRunningScript *runscr;
  DFsScript *script;
  DFraggleThinker *th;
  int snum;
  FParser *this_local;
  
  if (this->t_argc == 1) {
    uVar1 = intvalue(this->t_argv);
    if (((int)uVar1 < 0) || (0x100 < (int)uVar1)) {
      script_error("script number %d out of range\n",(ulong)uVar1);
    }
    else {
      this_00 = ::TObjPtr::operator_cast_to_DFraggleThinker_
                          ((TObjPtr *)&DFraggleThinker::ActiveThinker);
      if (this_00 != (DFraggleThinker *)0x0) {
        pDVar2 = TObjPtr<DFsScript>::operator->(&this_00->LevelScript);
        pDVar2 = ::TObjPtr::operator_cast_to_DFsScript_((TObjPtr *)(pDVar2->children + (int)uVar1));
        if (pDVar2 == (DFsScript *)0x0) {
          in_RSI = (size_t)uVar1;
          script_error("script %i not defined\n");
        }
        this_01 = (DRunningScript *)DObject::operator_new((DObject *)0xd8,in_RSI);
        trigger = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
        DRunningScript::DRunningScript(this_01,trigger,pDVar2,0);
        DFraggleThinker::AddRunningScript(this_00,this_01);
      }
    }
  }
  else {
    script_error("incorrect arguments to function\n");
  }
  return;
}

Assistant:

void FParser::SF_StartScript()
{
	if(t_argc != 1)
	{
		script_error("incorrect arguments to function\n");
		return;
	}
	
	int snum = intvalue(t_argv[0]);

	if(snum < 0 || snum >= MAXSCRIPTS)
	{
		script_error("script number %d out of range\n",snum);
		return;
	}

	DFraggleThinker *th = DFraggleThinker::ActiveThinker;
	if (th)
	{

		DFsScript *script = th->LevelScript->children[snum];
	
		if(!script)
		{
			script_error("script %i not defined\n", snum);
		}
		
		DRunningScript *runscr = new DRunningScript(Script->trigger, script, 0);
		// hook into chain at start
		th->AddRunningScript(runscr);
	}
}